

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
          *samples)

{
  pointer pRVar1;
  pointer pRVar2;
  float fVar3;
  float fVar4;
  int *piVar5;
  SampleBuilder *pSVar6;
  offset_in_SampleType_to_deUint64 in_RCX;
  ulong uVar7;
  string *psVar8;
  LogNumber<float> *pLVar9;
  long lVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  void *__buf_31;
  void *__buf_32;
  long lVar11;
  int __fd;
  size_type __n;
  ulong uVar12;
  ulong uVar13;
  ulong in_R9;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float xmin;
  float fVar18;
  float xmin_00;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float xmax;
  float xmax_00;
  float fVar23;
  float fVar24;
  float fVar25;
  RenderSampleAnalyzeResult RVar26;
  allocator<char> aStack_ae8;
  allocator<char> local_ae7;
  allocator<char> local_ae6;
  allocator<char> local_ae5;
  allocator<char> local_ae4;
  allocator<char> local_ae3;
  allocator<char> local_ae2;
  allocator<char> local_ae1;
  allocator<char> local_ae0;
  allocator<char> local_adf;
  allocator<char> local_ade;
  allocator<char> local_add;
  allocator<char> local_adc;
  allocator<char> local_adb;
  allocator<char> local_ada;
  allocator<char> local_ad9;
  allocator<char> local_ad8;
  allocator<char> local_ad7;
  allocator<char> local_ad6;
  allocator<char> local_ad5;
  float local_ad4;
  allocator<char> local_ad0;
  allocator<char> local_acf;
  allocator<char> local_ace;
  allocator<char> local_acd;
  allocator<char> local_acc;
  allocator<char> local_acb;
  allocator<char> local_aca;
  allocator<char> local_ac9;
  allocator<char> local_ac8;
  allocator<char> local_ac7;
  allocator<char> local_ac6;
  allocator<char> local_ac5;
  allocator<char> local_ac4;
  allocator<char> local_ac3;
  allocator<char> local_ac2;
  allocator<char> local_ac1;
  LineParametersWithConfidence contributionFitting;
  vector<float,_std::allocator<float>_> processingRates;
  LineParametersWithConfidence theilSenFitting;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  ScopedLogSection section_2;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  ScopedLogSection section_1;
  LogNumber<float> local_828;
  LogNumber<float> local_7c0;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  LogNumber<float> local_558;
  LogNumber<float> local_4f0;
  LogNumber<float> local_488;
  LogNumber<float> local_420;
  LogNumber<float> local_3b8;
  LogNumber<float> local_350;
  LogNumber<float> local_2e8;
  LogNumber<float> local_280;
  ScopedLogSection section;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  StatsType resultStats;
  
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x28,in_RCX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,(long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 6,
             (allocator_type *)&processingRates);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 6;
  lVar10 = 0;
  uVar13 = 0;
  if (0 < (int)__n) {
    uVar13 = __n & 0xffffffff;
  }
  for (; uVar13 * 8 != lVar10; lVar10 = lVar10 + 8) {
    *(deUint64 *)
     ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + lVar10) =
         (&(pRVar1->duration).fitResponseDuration)[lVar10];
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,__n,(allocator_type *)&local_828);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) >> 6;
  uVar12 = 0;
  uVar13 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar13 = uVar12;
  }
  piVar5 = &pRVar1->renderDataSize;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar7 < 0) {
      in_R9 = uVar7 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)*piVar5 / (((float)uVar7 / 1000.0) / 1000.0);
    piVar5 = piVar5 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.medianRate =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_828);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) >> 6;
  uVar12 = 0;
  uVar13 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar13 = uVar12;
  }
  piVar5 = &pRVar1->renderDataSize;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar7 < 0) {
      in_R9 = uVar7 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)uVar7 - ((float)*piVar5 * theilSenFitting.coefficient + theilSenFitting.offset);
    piVar5 = piVar5 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.maxDiff9DecileTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_828);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) >> 6;
  uVar12 = 0;
  uVar13 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar13 = uVar12;
  }
  piVar5 = &pRVar1->renderDataSize;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    fVar16 = (float)*piVar5 * theilSenFitting.coefficient + theilSenFitting.offset;
    fVar21 = 0.0;
    if (1.0 <= fVar16) {
      uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      if ((long)uVar7 < 0) {
        in_R9 = uVar7 >> 1;
      }
      fVar21 = ((float)uVar7 - fVar16) / fVar16;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) = fVar21;
    piVar5 = piVar5 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxRelDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.max9DecileRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar13 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = uVar13;
  if ((long)uVar13 < 0) {
    uVar7 = (ulong)((uint)uVar13 & 1) | uVar13 >> 1;
  }
  resultStats.result.minTime = (float)uVar13;
  uVar13 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if ((long)uVar13 < 0) {
    uVar7 = uVar13 >> 1;
  }
  resultStats.result.maxTime = (float)uVar13;
  resultStats.result.medianTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  resultStats.result.min2DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  resultStats.result.max9DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&resultStats.upload,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x0,uVar7);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&resultStats.render,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x8,uVar7);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&resultStats.read,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x10,uVar7);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&resultStats.total,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x18,uVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Samples",(allocator<char> *)&local_828);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Samples",(allocator<char> *)&local_7c0);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Samples",(allocator<char> *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"Samples",(allocator<char> *)&local_138);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_488,&local_4f0.m_name,&local_558.m_name)
  ;
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_488,__fd,__buf,(size_t)psVar8);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"DataSize",(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Data processed",(allocator<char> *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"bytes",(allocator<char> *)&local_198);
  psVar8 = &local_868;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&values,(string *)&contributionFitting,(string *)&section_1,psVar8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&values,__fd,__buf_00,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"UploadSize",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"Data uploaded",(allocator<char> *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"bytes",(allocator<char> *)&local_1f8);
  psVar8 = &local_8c8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&processingRates,&local_888,&local_8a8,psVar8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&processingRates,__fd,__buf_01,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"VertexCount",(allocator<char> *)&section_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"Number of vertices",&local_ad5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"vertices",&local_ad6);
  psVar8 = &local_928;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_828,&local_8e8,&local_908,psVar8,QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&local_828,__fd,__buf_02,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"DrawReadTime",&local_ad7)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"Draw call and ReadPixels time",&local_ad8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"us",&local_ad9);
  psVar8 = &local_578;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7c0,&local_948,&local_968,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_7c0,__fd,__buf_03,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"TotalTime",&local_ada);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"Total time",&local_adb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"us",&local_adc);
  psVar8 = &local_5d8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_280,&local_598,&local_5b8,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_280,__fd,__buf_04,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"Upload time",&local_add);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"Upload time",&local_ade);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"us",&local_adf);
  psVar8 = &local_638;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_2e8,&local_5f8,&local_618,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_2e8,__fd,__buf_05,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"DrawCallTime",&local_ae0)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"Draw call time",&local_ae1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"us",&local_ae2);
  psVar8 = &local_698;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_350,&local_658,&local_678,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_350,__fd,__buf_06,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"ReadTime",&local_ae3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"ReadPixels time",&local_ae4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"us",&local_ae5);
  psVar8 = &local_6f8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_3b8,&local_6b8,&local_6d8,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_3b8,__fd,__buf_07,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"FitResidual",&local_ae6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"Fit residual",&local_ae7)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"us",&aStack_ae8);
  psVar8 = &local_758;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_420,&local_718,&local_738,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_420,__fd,__buf_08,(size_t)psVar8);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_420);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_350);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_5f8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_280);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_598);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_828);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&values);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_488);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_4f0);
  lVar11 = 0;
  for (lVar10 = 0;
      pRVar1 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar10 < (int)((ulong)((long)(samples->
                                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) >> 6)
      ; lVar10 = lVar10 + 1) {
    local_ad4 = (float)*(ulong *)((long)&(pRVar1->duration).fitResponseDuration + lVar11);
    fVar16 = (float)*(int *)((long)&pRVar1->renderDataSize + lVar11) * theilSenFitting.coefficient +
             theilSenFitting.offset;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._8_16_ = ZEXT416(0);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    pSVar6 = tcu::SampleBuilder::operator<<
                       ((SampleBuilder *)&values,*(int *)((long)&pRVar1->renderDataSize + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               uploadedDataSize + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               numVertices + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderReadDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).totalDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).uploadDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).readDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,local_ad4 - fVar16);
    tcu::SampleBuilder::operator<<(pSVar6,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    lVar11 = lVar11 + 0x40;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Contribution",(allocator<char> *)&local_828);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Contributions",(allocator<char> *)&local_7c0);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"UploadConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Upload: Approximated contant cost",(allocator<char> *)&local_888)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_2e8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7c0.m_name,&local_280.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_09,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"UploadLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"Upload: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_420;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_350.m_name,&local_3b8.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_10,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"UploadMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Upload: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_558;
  tcu::LogNumber<float>::LogNumber
            (&local_828,&local_488.m_name,&local_4f0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.upload.medianTime);
  tcu::LogNumber<float>::write(&local_828,__fd,__buf_11,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_828);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_7c0);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"DrawCallConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"DrawCall: Approximated contant cost",
             (allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_2e8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7c0.m_name,&local_280.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_12,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"DrawCallLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"DrawCall: Approximated linear cost",(allocator<char> *)&local_8e8
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_420;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_350.m_name,&local_3b8.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_13,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"DrawCallMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"DrawCall: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_558;
  tcu::LogNumber<float>::LogNumber
            (&local_828,&local_488.m_name,&local_4f0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.render.medianTime);
  tcu::LogNumber<float>::write(&local_828,__fd,__buf_14,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_828);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_7c0);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x10,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"ReadConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Read: Approximated contant cost",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_2e8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7c0.m_name,&local_280.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_15,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"ReadLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"Read: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_420;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_350.m_name,&local_3b8.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_16,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"ReadMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Read: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_558;
  tcu::LogNumber<float>::LogNumber
            (&local_828,&local_488.m_name,&local_4f0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.read.medianTime);
  tcu::LogNumber<float>::write(&local_828,__fd,__buf_17,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_828);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_7c0);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x18,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"TotalConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Total: Approximated contant cost",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_2e8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7c0.m_name,&local_280.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_18,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"TotalLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"Total: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_420;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_350.m_name,&local_3b8.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_19,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"TotalMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Total: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_558;
  tcu::LogNumber<float>::LogNumber
            (&local_828,&local_488.m_name,&local_4f0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.total.medianTime);
  tcu::LogNumber<float>::write(&local_828,__fd,__buf_20,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_828);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_7c0);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Results",(allocator<char> *)&local_828);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Results",(allocator<char> *)&local_7c0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&values,(string *)&processingRates);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_ad4 = (float)((pRVar2[-1].renderDataSize + pRVar1->renderDataSize) / 2);
  fVar22 = theilSenFitting.coefficient * local_ad4;
  fVar17 = theilSenFitting.offset + fVar22;
  uVar13 = (ulong)((long)pRVar2 - (long)pRVar1) >> 6;
  uVar13 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) / 2;
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&values,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x0,(int)uVar13,0x28,in_R9);
  (anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&processingRates,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)(uVar13 & 0xffffffff),
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),0x28,in_R9);
  fVar21 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
  fVar16 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  xmin = (float)pRVar1->renderDataSize;
  fVar24 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax = (float)pRVar2[-1].renderDataSize;
  fVar18 = getAreaBetweenLines(xmin,xmax,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)&values,samples,0,
             (int)((ulong)((long)pRVar2 - (long)pRVar1) >> 6),2,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            ((LineParametersWithConfidence *)&processingRates,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),2,0x28);
  xmin_00 = (float)((samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  fVar25 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar4 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax_00 = (float)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  fVar19 = getAreaBetweenLines(xmin_00,xmax_00,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"ResultLinearity",&local_ad5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Sample linearity",&local_ad6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"%",&local_ad7);
  fVar20 = fVar3 * xmin + fVar24;
  fVar23 = fVar21 * xmin + fVar16;
  uVar14 = -(uint)(fVar20 <= fVar23);
  fVar24 = fVar3 * xmax + fVar24;
  fVar16 = fVar21 * xmax + fVar16;
  uVar15 = -(uint)(fVar16 <= fVar24);
  fVar16 = ((float)(~uVar15 & (uint)fVar16 | (uint)fVar24 & uVar15) -
           (float)(~uVar14 & (uint)fVar23 | (uint)fVar20 & uVar14)) * (xmax - xmin);
  fVar21 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - fVar18 / fVar16));
  fVar16 = 1.0;
  if (fVar21 <= 1.0) {
    fVar16 = fVar21;
  }
  psVar8 = &local_868;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,(string *)&contributionFitting,(string *)&section_1,psVar8,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_21,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"SampleTemporalStability",&local_ad8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"Sample temporal stability",&local_ad9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"%",&local_ada);
  fVar16 = fVar4 * xmin_00 + fVar25;
  fVar21 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmin_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar14 = -(uint)(fVar16 <= fVar21);
  fVar25 = fVar4 * xmax_00 + fVar25;
  fVar24 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmax_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar15 = -(uint)(fVar24 <= fVar25);
  fVar16 = ((float)(~uVar15 & (uint)fVar24 | (uint)fVar25 & uVar15) -
           (float)(~uVar14 & (uint)fVar21 | (uint)fVar16 & uVar14)) * (xmax_00 - xmin_00);
  fVar21 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - fVar19 / fVar16));
  fVar16 = 1.0;
  if (fVar21 <= 1.0) {
    fVar16 = fVar21;
  }
  psVar8 = &local_8c8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_888,&local_8a8,psVar8,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_22,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"ApproximatedConstantCost",&local_adb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"Approximated contant cost",&local_adc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"us",&local_add);
  psVar8 = &local_928;
  tcu::LogNumber<float>::LogNumber
            (&local_828,&local_8e8,&local_908,psVar8,QP_KEY_TAG_TIME,theilSenFitting.offset);
  tcu::LogNumber<float>::write(&local_828,__fd,__buf_23,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"ApproximatedConstantCostConfidence60Lower",&local_ade);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"Approximated contant cost 60% confidence lower limit",&local_adf)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"us",&local_ae0);
  psVar8 = &local_578;
  tcu::LogNumber<float>::LogNumber
            (&local_7c0,&local_948,&local_968,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_7c0,__fd,__buf_24,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"ApproximatedConstantCostConfidence60Upper",&local_ae1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"Approximated contant cost 60% confidence upper limit",&local_ae2)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"us",&local_ae3);
  psVar8 = &local_5d8;
  tcu::LogNumber<float>::LogNumber
            (&local_280,&local_598,&local_5b8,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_280,__fd,__buf_25,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"ApproximatedLinearCost",&local_ae4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"Approximated linear cost",&local_ae5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"us / MB",&local_ae6);
  psVar8 = &local_638;
  tcu::LogNumber<float>::LogNumber
            (&local_2e8,&local_5f8,&local_618,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_2e8,__fd,__buf_26,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"ApproximatedLinearCostConfidence60Lower",&local_ae7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"Approximated linear cost 60% confidence lower limit",&aStack_ae8)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"us / MB",&local_ac1);
  psVar8 = &local_698;
  tcu::LogNumber<float>::LogNumber
            (&local_350,&local_658,&local_678,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_350,__fd,__buf_27,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"ApproximatedLinearCostConfidence60Upper",&local_ac2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"Approximated linear cost 60% confidence upper limit",&local_ac3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"us / MB",&local_ac4);
  psVar8 = &local_6f8;
  tcu::LogNumber<float>::LogNumber
            (&local_3b8,&local_6b8,&local_6d8,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_3b8,__fd,__buf_28,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"ApproximatedProcessRate",&local_ac5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"Approximated processing rate",&local_ac6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"MB / s",&local_ac7);
  fVar16 = local_ad4 / ((fVar17 / 1000.0) / 1000.0);
  psVar8 = &local_758;
  tcu::LogNumber<float>::LogNumber
            (&local_420,&local_718,&local_738,psVar8,QP_KEY_TAG_PERFORMANCE,
             fVar16 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_420,__fd,__buf_29,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"ApproximatedProcessRateNoConstant",&local_ac8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Approximated processing rate without constant cost",&local_ac9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"MB / s",&local_aca);
  psVar8 = &local_138;
  tcu::LogNumber<float>::LogNumber
            (&local_488,(string *)&section,&local_118,psVar8,QP_KEY_TAG_PERFORMANCE,
             (local_ad4 / ((fVar22 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_488,__fd,__buf_30,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"SampleMedianTime",&local_acb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Median sample time",&local_acc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"us",&local_acd);
  psVar8 = &local_198;
  tcu::LogNumber<float>::LogNumber
            (&local_4f0,&local_158,&local_178,psVar8,QP_KEY_TAG_TIME,resultStats.result.medianTime);
  tcu::LogNumber<float>::write(&local_4f0,__fd,__buf_31,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"SampleMedianProcess",&local_ace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"Median processing rate",&local_acf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"MB / s",&local_ad0);
  psVar8 = &local_1f8;
  tcu::LogNumber<float>::LogNumber
            (&local_558,&local_1b8,&local_1d8,psVar8,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_558,__fd,__buf_32,(size_t)psVar8);
  tcu::LogNumber<float>::~LogNumber(&local_558);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  tcu::LogNumber<float>::~LogNumber(&local_4f0);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  tcu::LogNumber<float>::~LogNumber(&local_488);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&section);
  tcu::LogNumber<float>::~LogNumber(&local_420);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  tcu::LogNumber<float>::~LogNumber(&local_3b8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogNumber<float>::~LogNumber(&local_350);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  tcu::LogNumber<float>::~LogNumber(&local_2e8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_5f8);
  tcu::LogNumber<float>::~LogNumber(&local_280);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_598);
  tcu::LogNumber<float>::~LogNumber(&local_7c0);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  tcu::LogNumber<float>::~LogNumber(&local_828);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  RVar26.renderRateAtRange = fVar16;
  RVar26.renderRateMedian = resultStats.medianRate;
  RVar26.renderRateAtInfinity = resultStats.medianRate;
  return RVar26;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}